

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

leb_Node leb_DecodeNode(leb_Heap *leb,uint32_t nodeID)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  leb_Node node;
  leb_Node node_00;
  leb_Node node_01;
  leb_Node node_02;
  long lVar6;
  int iVar7;
  leb_Node lVar8;
  
  node.depth = 0;
  node.id = leb->maxDepth;
  lVar8.id = 1;
  lVar8.depth = 0;
  uVar2 = leb__HeapRead((leb_Heap *)leb->buffer,node);
  if (nodeID < uVar2) {
    node_00.depth = 0;
    node_00.id = leb->maxDepth;
    uVar2 = leb__HeapRead((leb_Heap *)leb->buffer,node_00);
    if (1 < uVar2) {
      lVar6 = 0;
      iVar1 = 1;
      do {
        uVar5 = nodeID;
        iVar7 = iVar1;
        lVar6 = lVar6 + 0x100000000;
        node_01.depth = 0;
        node_01.id = leb->maxDepth;
        uVar3 = leb__HeapRead((leb_Heap *)leb->buffer,node_01);
        uVar2 = 0;
        if (uVar3 <= uVar5) {
          uVar2 = uVar3;
        }
        node_02.depth = 0;
        node_02.id = leb->maxDepth;
        uVar4 = leb__HeapRead((leb_Heap *)leb->buffer,node_02);
        iVar1 = (uint)(uVar3 <= uVar5) + iVar7 * 2;
        nodeID = uVar5 - uVar2;
      } while (1 < uVar4);
      lVar8 = (leb_Node)((ulong)((uint)(uVar3 <= uVar5) + iVar7 * 2) + lVar6);
    }
    return lVar8;
  }
  __assert_fail("nodeID < leb_NodeCount(leb) && \"nodeID > NodeCount(leb)\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x300,"leb_Node leb_DecodeNode(const leb_Heap *, uint32_t)");
}

Assistant:

LEBDEF leb_Node leb_DecodeNode(const leb_Heap *leb, uint32_t nodeID)
{
    LEB_ASSERT(nodeID < leb_NodeCount(leb) && "nodeID > NodeCount(leb)");

    leb_Node node = {1u, 0};

    while (leb__HeapRead(leb, node) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {node.id<<= 1u, ++node.depth});
        uint32_t b = nodeID < cmp ? 0 : 1;

        node.id|= b;
        nodeID-= cmp * b;
    }

    return node;
}